

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockNodeUpdate(ImGuiDockNode *node)

{
  long lVar1;
  ImGuiDockNode *this;
  ImGuiWindow *pIVar2;
  ImDrawList *pIVar3;
  ImGuiIO *pIVar4;
  ImGuiContext *node_00;
  bool bVar5;
  ImU32 IVar6;
  ImGuiWindow **ppIVar7;
  ImGuiPayload *this_00;
  ImVec2 *pIVar8;
  bool local_162;
  bool local_161;
  ImGuiWindow *local_150;
  bool local_141;
  ImVec2 local_138;
  ImRect local_130;
  ImRect local_120;
  ImVec2 local_110;
  ImVec2 local_108;
  ImVec2 local_100;
  ImVec2 local_f8;
  ImVec2 local_f0;
  ImVec2 local_e8;
  undefined1 local_e0 [8];
  ImRect hole_rect;
  undefined1 local_c8 [8];
  ImRect root_rect;
  ImGuiDockNode *root_node;
  ImGuiPayload *payload;
  bool central_node_hole_register_hit_test_hole;
  bool central_node_hole;
  ImGuiDockNode *central_node;
  bool render_dockspace_bg;
  ImGuiWindowFlags local_8c;
  char local_88 [4];
  ImGuiWindowFlags window_flags;
  char window_label [20];
  ImVec2 local_68;
  ImVec2 local_60;
  ImGuiWindow *local_58;
  ImGuiWindow *ref_window_1;
  ImGuiWindow *pIStack_48;
  bool beginned_into_host_window;
  ImGuiWindow *host_window;
  ImGuiWindow *window;
  int window_n;
  ImGuiDockNodeFlags node_flags;
  ImGuiWindow *ref_window;
  ImGuiWindow *single_window;
  ImGuiContext *pIStack_18;
  bool want_to_hide_host_window;
  ImGuiContext *g;
  ImGuiDockNode *node_local;
  
  pIStack_18 = GImGui;
  g = (ImGuiContext *)node;
  if (node->LastFrameActive == GImGui->FrameCount) {
    __assert_fail("node->LastFrameActive != g.FrameCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x3665,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
  }
  node->LastFrameAlive = GImGui->FrameCount;
  node->field_0xbe = node->field_0xbe & 0xf7;
  node->OnlyNodeWithWindows = (ImGuiDockNode *)0x0;
  node->CentralNode = (ImGuiDockNode *)0x0;
  bVar5 = ImGuiDockNode::IsRootNode(node);
  if (bVar5) {
    DockNodeUpdateForRootNode((ImGuiDockNode *)g);
  }
  if ((*(long *)((g->IO).KeyMap + 1) != 0) &&
     (bVar5 = ImGuiDockNode::IsNoTabBar((ImGuiDockNode *)g), bVar5)) {
    DockNodeRemoveTabBar((ImGuiDockNode *)g);
  }
  single_window._7_1_ = 0;
  bVar5 = ImGuiDockNode::IsFloatingNode((ImGuiDockNode *)g);
  if (bVar5) {
    if (((((int)(g->IO).MouseDoubleClickTime < 2) &&
         (bVar5 = ImGuiDockNode::IsLeafNode((ImGuiDockNode *)g), bVar5)) &&
        (((pIStack_18->IO).ConfigDockingAlwaysTabBar & 1U) == 0)) &&
       (((g->IO).MouseDoubleClickTime == 0.0 ||
        (ppIVar7 = ImVector<ImGuiWindow_*>::operator[]
                             ((ImVector<ImGuiWindow_*> *)&(g->IO).MouseDoubleClickTime,0),
        (((*ppIVar7)->WindowClass).DockingAlwaysTabBar & 1U) == 0)))) {
      single_window._7_1_ = 1;
    }
    if (*(int *)&(g->IO).UserData == 0) {
      single_window._7_1_ = 1;
    }
  }
  if ((single_window._7_1_ & 1) == 0) {
    if (((((*(ushort *)((long)&(g->IO).FontDefault + 4) >> 9 & 1) != 0) &&
         (*(long *)((g->IO).KeyMap + 0x11) == 0)) &&
        (bVar5 = ImGuiDockNode::IsFloatingNode((ImGuiDockNode *)g), bVar5)) &&
       (bVar5 = ImGuiDockNode::IsLeafNode((ImGuiDockNode *)g), bVar5)) {
      if ((int)(g->IO).MouseDoubleClickTime < 1) {
        __assert_fail("node->Windows.Size > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x36ac,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
      }
      _window_n = (ImGuiWindow *)0x0;
      if (*(int *)&(g->IO).FontAllowUserScaling != 0) {
        _window_n = DockNodeFindWindowByID
                              ((ImGuiDockNode *)g,*(ImGuiID *)&(g->IO).FontAllowUserScaling);
      }
      if (_window_n == (ImGuiWindow *)0x0) {
        ppIVar7 = ImVector<ImGuiWindow_*>::operator[]
                            ((ImVector<ImGuiWindow_*> *)&(g->IO).MouseDoubleClickTime,0);
        _window_n = *ppIVar7;
      }
      if (('\0' < _window_n->AutoFitFramesX) || ('\0' < _window_n->AutoFitFramesY)) {
        (g->IO).DisplaySize.y = 2.8026e-45;
        return;
      }
    }
    window._4_4_ = (g->IO).DisplaySize.x;
    local_141 = 0 < (int)(g->IO).MouseDoubleClickTime && ((uint)window._4_4_ & 0x4000) == 0;
    *(ushort *)((long)&(g->IO).FontDefault + 4) =
         *(ushort *)((long)&(g->IO).FontDefault + 4) & 0xefff | (ushort)local_141 << 0xc;
    *(ushort *)((long)&(g->IO).FontDefault + 4) =
         *(ushort *)((long)&(g->IO).FontDefault + 4) & 0xf7ff;
    for (window._0_4_ = 0; (int)window < (int)(g->IO).MouseDoubleClickTime;
        window._0_4_ = (int)window + 1) {
      ppIVar7 = ImVector<ImGuiWindow_*>::operator[]
                          ((ImVector<ImGuiWindow_*> *)&(g->IO).MouseDoubleClickTime,(int)window);
      host_window = *ppIVar7;
      *(ushort *)((long)&(g->IO).FontDefault + 4) =
           *(ushort *)((long)&(g->IO).FontDefault + 4) & 0xf7ff |
           (ushort)(((byte)((ushort)*(undefined2 *)((long)&(g->IO).FontDefault + 4) >> 0xb) & 1) !=
                    0 || (host_window->HasCloseButton & 1U) != 0) << 0xb;
      host_window->field_0x3e1 =
           host_window->field_0x3e1 & 0xfe | 1 < (int)(g->IO).MouseDoubleClickTime;
    }
    if (((uint)window._4_4_ & 0x8000) != 0) {
      *(ushort *)((long)&(g->IO).FontDefault + 4) =
           *(ushort *)((long)&(g->IO).FontDefault + 4) & 0xf7ff;
    }
    pIStack_48 = (ImGuiWindow *)0x0;
    ref_window_1._7_1_ = 0;
    bVar5 = ImGuiDockNode::IsDockSpace((ImGuiDockNode *)g);
    if (bVar5) {
      if (*(long *)((g->IO).KeyMap + 0x11) == 0) {
        __assert_fail("node->HostWindow",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x36ce,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
      }
      pIStack_48 = *(ImGuiWindow **)((g->IO).KeyMap + 0x11);
    }
    else {
      bVar5 = ImGuiDockNode::IsRootNode((ImGuiDockNode *)g);
      if ((bVar5) && ((*(ushort *)((long)&(g->IO).FontDefault + 4) >> 9 & 1) != 0)) {
        if ((int)(g->IO).MouseDoubleClickTime < 1) {
          local_150 = (ImGuiWindow *)0x0;
        }
        else {
          ppIVar7 = ImVector<ImGuiWindow_*>::operator[]
                              ((ImVector<ImGuiWindow_*> *)&(g->IO).MouseDoubleClickTime,0);
          local_150 = *ppIVar7;
        }
        local_58 = local_150;
        if (((short)(*(short *)((long)&(g->IO).FontDefault + 4) << 0xd) >> 0xd == 2) &&
           (local_150 != (ImGuiWindow *)0x0)) {
          ImVec2::ImVec2(&local_60,0.0,0.0);
          SetNextWindowPos(&local_150->Pos,0,&local_60);
        }
        else if ((short)(*(short *)((long)&(g->IO).FontDefault + 4) << 0xd) >> 0xd == 1) {
          pIVar4 = &g->IO;
          ImVec2::ImVec2(&local_68,0.0,0.0);
          SetNextWindowPos((ImVec2 *)(pIVar4->KeyMap + 3),0,&local_68);
        }
        if (((short)(*(short *)((long)&(g->IO).FontDefault + 4) << 10) >> 0xd == 2) &&
           (local_58 != (ImGuiWindow *)0x0)) {
          SetNextWindowSize(&local_58->SizeFull,0);
        }
        else if ((short)(*(short *)((long)&(g->IO).FontDefault + 4) << 10) >> 0xd == 1) {
          SetNextWindowSize((ImVec2 *)((g->IO).KeyMap + 5),0);
        }
        if (((short)(*(short *)((long)&(g->IO).FontDefault + 4) << 10) >> 0xd == 2) &&
           (local_58 != (ImGuiWindow *)0x0)) {
          SetNextWindowCollapsed((bool)(local_58->Collapsed & 1),0);
        }
        if (((short)(*(short *)((long)&(g->IO).FontDefault + 4) << 7) >> 0xd == 2) &&
           (local_58 != (ImGuiWindow *)0x0)) {
          SetNextWindowViewport(local_58->ViewportId);
        }
        SetNextWindowClass((ImGuiWindowClass *)((g->IO).KeyMap + 10));
        DockNodeGetHostWindowTitle((ImGuiDockNode *)g,local_88,0x14);
        local_8c = 0x20081139;
        ImVec2::ImVec2((ImVec2 *)((long)&central_node + 4),0.0,0.0);
        PushStyleVar(2,(ImVec2 *)((long)&central_node + 4));
        Begin(local_88,(bool *)0x0,local_8c);
        PopStyleVar(1);
        ref_window_1._7_1_ = 1;
        pIStack_48 = pIStack_18->CurrentWindow;
        DockNodeSetupHostWindow((ImGuiDockNode *)g,pIStack_48);
        (pIStack_48->DC).CursorPos = pIStack_48->Pos;
        *(ImVec2 *)((g->IO).KeyMap + 3) = pIStack_48->Pos;
        *(ImVec2 *)((g->IO).KeyMap + 5) = pIStack_48->Size;
        if ((*(byte *)(*(long *)((g->IO).KeyMap + 0x11) + 0xcd) & 1) != 0) {
          BringWindowToDisplayFront(*(ImGuiWindow **)((g->IO).KeyMap + 0x11));
        }
        *(ushort *)((long)&(g->IO).FontDefault + 4) =
             *(ushort *)((long)&(g->IO).FontDefault + 4) & 0xfe3f;
        *(ushort *)((long)&(g->IO).FontDefault + 4) =
             *(ushort *)((long)&(g->IO).FontDefault + 4) & 0xffc7;
        *(ushort *)((long)&(g->IO).FontDefault + 4) =
             *(ushort *)((long)&(g->IO).FontDefault + 4) & 0xfff8;
      }
      else {
        lVar1._0_4_ = (g->IO).DeltaTime;
        lVar1._4_4_ = (g->IO).IniSavingRate;
        if (lVar1 != 0) {
          pIStack_48 = *(ImGuiWindow **)(*(long *)&(g->IO).DeltaTime + 0x80);
          *(ImGuiWindow **)((g->IO).KeyMap + 0x11) = pIStack_48;
          *(ushort *)((long)&(g->IO).FontDefault + 4) =
               *(ushort *)((long)&(g->IO).FontDefault + 4) & 0xfe3f;
          *(ushort *)((long)&(g->IO).FontDefault + 4) =
               *(ushort *)((long)&(g->IO).FontDefault + 4) & 0xffc7;
          *(ushort *)((long)&(g->IO).FontDefault + 4) =
               *(ushort *)((long)&(g->IO).FontDefault + 4) & 0xfff8;
        }
      }
      if ((((ulong)(g->IO).FontDefault & 0x1000000000000) != 0) &&
         (*(long *)((g->IO).KeyMap + 0x11) != 0)) {
        DockNodeStartMouseMovingWindow((ImGuiDockNode *)g,*(ImGuiWindow **)((g->IO).KeyMap + 0x11));
      }
    }
    bVar5 = ImGuiDockNode::IsSplitNode((ImGuiDockNode *)g);
    if ((bVar5) && (*(long *)((g->IO).KeyMap + 1) != 0)) {
      __assert_fail("node->TabBar == __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x3717,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
    }
    bVar5 = ImGuiDockNode::IsRootNode((ImGuiDockNode *)g);
    if ((((bVar5) && (pIStack_18->NavWindow != (ImGuiWindow *)0x0)) &&
        (pIStack_18->NavWindow->RootWindow->DockNode != (ImGuiDockNode *)0x0)) &&
       (pIStack_18->NavWindow->RootWindow->ParentWindow == pIStack_48)) {
      (g->IO).FontGlobalScale = (float)pIStack_18->NavWindow->RootWindow->DockNode->ID;
    }
    bVar5 = ImGuiDockNode::IsRootNode((ImGuiDockNode *)g);
    local_161 = false;
    if ((bVar5) && (local_161 = false, pIStack_48 != (ImGuiWindow *)0x0)) {
      local_161 = ((uint)window._4_4_ & 8) != 0;
    }
    central_node._3_1_ = local_161;
    if (local_161 != false) {
      ImDrawList::ChannelsSplit(pIStack_48->DrawList,2);
      ImDrawList::ChannelsSetCurrent(pIStack_48->DrawList,1);
    }
    this = *(ImGuiDockNode **)((g->IO).KeyMap + 0x15);
    bVar5 = ImGuiDockNode::IsRootNode((ImGuiDockNode *)g);
    local_162 = false;
    if (((bVar5) && (local_162 = false, pIStack_48 != (ImGuiWindow *)0x0)) &&
       ((local_162 = false, ((uint)window._4_4_ & 8) != 0 &&
        (local_162 = false, this != (ImGuiDockNode *)0x0)))) {
      local_162 = ImGuiDockNode::IsEmpty(this);
    }
    payload._6_1_ = local_162;
    if ((((local_162 != false) && (this_00 = GetDragDropPayload(), this_00 != (ImGuiPayload *)0x0))
        && (bVar5 = ImGuiPayload::IsDataType(this_00,"_IMWINDOW"), bVar5)) &&
       (bVar5 = DockNodeIsDropAllowed(pIStack_48,*this_00->Data), bVar5)) {
      payload._6_1_ = false;
    }
    if (payload._6_1_ != false) {
      bVar5 = ImGuiDockNode::IsDockSpace((ImGuiDockNode *)g);
      if (!bVar5) {
        __assert_fail("node->IsDockSpace()",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x3732,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
      }
      root_rect.Max = (ImVec2)DockNodeGetRootNode(this);
      pIVar8 = (ImVec2 *)((long)root_rect.Max + 0x48);
      hole_rect.Max = operator+(pIVar8,(ImVec2 *)((long)root_rect.Max + 0x50));
      ImRect::ImRect((ImRect *)local_c8,pIVar8,&hole_rect.Max);
      local_e8 = operator+(&this->Pos,&this->Size);
      ImRect::ImRect((ImRect *)local_e0,&this->Pos,&local_e8);
      if ((float)local_c8._0_4_ < (float)local_e0._0_4_) {
        local_e0._0_4_ = (float)local_e0._0_4_ + 4.0;
      }
      if (hole_rect.Min.x < root_rect.Min.x) {
        hole_rect.Min.x = hole_rect.Min.x - 4.0;
      }
      if ((float)local_c8._4_4_ < (float)local_e0._4_4_) {
        local_e0._4_4_ = (float)local_e0._4_4_ + 4.0;
      }
      if (hole_rect.Min.y < root_rect.Min.y) {
        hole_rect.Min.y = hole_rect.Min.y - 4.0;
      }
      if ((local_162 != false) &&
         (bVar5 = ImRect::IsInverted((ImRect *)local_e0), pIVar2 = pIStack_48, !bVar5)) {
        local_f0 = operator-(&hole_rect.Min,(ImVec2 *)local_e0);
        SetWindowHitTestHole(pIVar2,(ImVec2 *)local_e0,&local_f0);
        pIVar2 = pIStack_48->ParentWindow;
        local_f8 = operator-(&hole_rect.Min,(ImVec2 *)local_e0);
        SetWindowHitTestHole(pIVar2,(ImVec2 *)local_e0,&local_f8);
      }
    }
    bVar5 = ImGuiDockNode::IsRootNode((ImGuiDockNode *)g);
    if ((bVar5) && (pIStack_48 != (ImGuiWindow *)0x0)) {
      local_100 = pIStack_48->Pos;
      local_108 = pIStack_48->Size;
      DockNodeTreeUpdatePosSize((ImGuiDockNode *)g,local_100,local_108,false);
      DockNodeTreeUpdateSplitter((ImGuiDockNode *)g);
    }
    if ((((pIStack_48 != (ImGuiWindow *)0x0) &&
         (bVar5 = ImGuiDockNode::IsEmpty((ImGuiDockNode *)g), bVar5)) &&
        ((*(ushort *)((long)&(g->IO).FontDefault + 4) >> 9 & 1) != 0)) &&
       (((uint)window._4_4_ & 8) == 0)) {
      pIVar3 = pIStack_48->DrawList;
      pIVar8 = (ImVec2 *)((g->IO).KeyMap + 3);
      local_110 = operator+(pIVar8,(ImVec2 *)((g->IO).KeyMap + 5));
      IVar6 = GetColorU32(0x27,1.0);
      ImDrawList::AddRectFilled(pIVar3,pIVar8,&local_110,IVar6,0.0,0);
    }
    if (((central_node._3_1_ & 1) != 0) &&
       ((*(ushort *)((long)&(g->IO).FontDefault + 4) >> 9 & 1) != 0)) {
      ImDrawList::ChannelsSetCurrent(pIStack_48->DrawList,0);
      if (local_162 == false) {
        pIVar3 = pIStack_48->DrawList;
        pIVar8 = (ImVec2 *)((g->IO).KeyMap + 3);
        local_138 = operator+(pIVar8,(ImVec2 *)((g->IO).KeyMap + 5));
        IVar6 = GetColorU32(2,1.0);
        ImDrawList::AddRectFilled(pIVar3,pIVar8,&local_138,IVar6,0.0,0);
      }
      else {
        pIVar3 = pIStack_48->DrawList;
        local_120 = ImGuiDockNode::Rect((ImGuiDockNode *)g);
        local_130 = ImGuiDockNode::Rect(this);
        IVar6 = GetColorU32(2,1.0);
        RenderRectFilledWithHole(pIVar3,local_120,local_130,IVar6,0.0);
      }
      ImDrawList::ChannelsMerge(pIStack_48->DrawList);
    }
    if ((pIStack_48 == (ImGuiWindow *)0x0) || ((int)(g->IO).MouseDoubleClickTime < 1)) {
      *(ushort *)((long)&(g->IO).FontDefault + 4) =
           *(ushort *)((long)&(g->IO).FontDefault + 4) & 0xbfff;
      *(undefined4 *)&(g->IO).FontDefault = 0;
      *(ushort *)((long)&(g->IO).FontDefault + 4) =
           *(ushort *)((long)&(g->IO).FontDefault + 4) & 0xfbff;
    }
    else {
      DockNodeUpdateTabBar((ImGuiDockNode *)g,pIStack_48);
    }
    if ((*(long *)((g->IO).KeyMap + 1) == 0) ||
       (*(int *)(*(long *)((g->IO).KeyMap + 1) + 0x18) == 0)) {
      if (0 < (int)(g->IO).MouseDoubleClickTime) {
        ppIVar7 = ImVector<ImGuiWindow_*>::operator[]
                            ((ImVector<ImGuiWindow_*> *)&(g->IO).MouseDoubleClickTime,0);
        *(ImGuiID *)&(g->IO).FontAllowUserScaling = (*ppIVar7)->ID;
      }
    }
    else {
      *(undefined4 *)&(g->IO).FontAllowUserScaling =
           *(undefined4 *)(*(long *)((g->IO).KeyMap + 1) + 0x18);
    }
    if ((((pIStack_48 != (ImGuiWindow *)0x0) &&
         ((*(ushort *)((long)&(g->IO).FontDefault + 4) >> 9 & 1) != 0)) &&
        (bVar5 = ImGuiDockNode::IsRootNode((ImGuiDockNode *)g), bVar5)) &&
       ((pIStack_18->MovingWindow == (ImGuiWindow *)0x0 ||
        (pIStack_18->MovingWindow->RootWindowDockTree != pIStack_48)))) {
      BeginDockableDragDropTarget(pIStack_48);
    }
    *(int *)&(g->IO).Fonts = pIStack_18->FrameCount;
    if (pIStack_48 != (ImGuiWindow *)0x0) {
      if ((g->IO).IniFilename != (char *)0x0) {
        DockNodeUpdate((ImGuiDockNode *)(g->IO).IniFilename);
      }
      if ((g->IO).LogFilename != (char *)0x0) {
        DockNodeUpdate((ImGuiDockNode *)(g->IO).LogFilename);
      }
      bVar5 = ImGuiDockNode::IsRootNode((ImGuiDockNode *)g);
      if (bVar5) {
        RenderWindowOuterBorders(pIStack_48);
      }
    }
    if ((ref_window_1._7_1_ & 1) != 0) {
      End();
    }
  }
  else {
    if ((g->IO).MouseDoubleClickTime == 1.4013e-45) {
      ppIVar7 = ImVector<ImGuiWindow_*>::operator[]
                          ((ImVector<ImGuiWindow_*> *)&(g->IO).MouseDoubleClickTime,0);
      ref_window = *ppIVar7;
      *(ImVec2 *)((g->IO).KeyMap + 3) = ref_window->Pos;
      *(ImVec2 *)((g->IO).KeyMap + 5) = ref_window->SizeFull;
      *(ushort *)((long)&(g->IO).FontDefault + 4) =
           *(ushort *)((long)&(g->IO).FontDefault + 4) & 0xfe3f | 0x80;
      *(ushort *)((long)&(g->IO).FontDefault + 4) =
           *(ushort *)((long)&(g->IO).FontDefault + 4) & 0xffc7 | 0x10;
      *(ushort *)((long)&(g->IO).FontDefault + 4) =
           *(ushort *)((long)&(g->IO).FontDefault + 4) & 0xfff8 | 2;
      if ((*(long *)((g->IO).KeyMap + 0x11) != 0) &&
         (pIStack_18->NavWindow == *(ImGuiWindow **)((g->IO).KeyMap + 0x11))) {
        FocusWindow(ref_window);
      }
      if (*(long *)((g->IO).KeyMap + 0x11) != 0) {
        ref_window->Viewport = *(ImGuiViewportP **)(*(long *)((g->IO).KeyMap + 0x11) + 0x30);
        ref_window->ViewportId = *(ImGuiID *)(*(long *)((g->IO).KeyMap + 0x11) + 0x38);
        if ((*(byte *)(*(long *)((g->IO).KeyMap + 0x11) + 0xc6) & 1) != 0) {
          ref_window->Viewport->Window = ref_window;
          ref_window->ViewportOwned = true;
        }
      }
    }
    DockNodeHideHostWindow((ImGuiDockNode *)g);
    node_00 = g;
    (g->IO).DisplaySize.y = 1.4013e-45;
    *(ushort *)((long)&(g->IO).FontDefault + 4) =
         *(ushort *)((long)&(g->IO).FontDefault + 4) & 0xbfff;
    *(undefined4 *)&(g->IO).FontDefault = 0;
    *(ushort *)((long)&(g->IO).FontDefault + 4) =
         *(ushort *)((long)&(g->IO).FontDefault + 4) & 0xefff;
    *(ushort *)((long)&(g->IO).FontDefault + 4) =
         *(ushort *)((long)&(g->IO).FontDefault + 4) & 0xf7ff;
    *(int *)&(g->IO).Fonts = pIStack_18->FrameCount;
    if ((((ulong)(g->IO).FontDefault & 0x1000000000000) != 0) &&
       ((g->IO).MouseDoubleClickTime == 1.4013e-45)) {
      ppIVar7 = ImVector<ImGuiWindow_*>::operator[]
                          ((ImVector<ImGuiWindow_*> *)&(g->IO).MouseDoubleClickTime,0);
      DockNodeStartMouseMovingWindow((ImGuiDockNode *)node_00,*ppIVar7);
    }
  }
  return;
}

Assistant:

static void ImGui::DockNodeUpdate(ImGuiDockNode* node)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(node->LastFrameActive != g.FrameCount);
    node->LastFrameAlive = g.FrameCount;
    node->MarkedForPosSizeWrite = false;

    node->CentralNode = node->OnlyNodeWithWindows = NULL;
    if (node->IsRootNode())
        DockNodeUpdateForRootNode(node);

    // Remove tab bar if not needed
    if (node->TabBar && node->IsNoTabBar())
        DockNodeRemoveTabBar(node);

    // Early out for hidden root dock nodes (when all DockId references are in inactive windows, or there is only 1 floating window holding on the DockId)
    bool want_to_hide_host_window = false;
    if (node->IsFloatingNode())
    {
        if (node->Windows.Size <= 1 && node->IsLeafNode())
            if (!g.IO.ConfigDockingAlwaysTabBar && (node->Windows.Size == 0 || !node->Windows[0]->WindowClass.DockingAlwaysTabBar))
                want_to_hide_host_window = true;
        if (node->CountNodeWithWindows == 0)
            want_to_hide_host_window = true;
    }
    if (want_to_hide_host_window)
    {
        if (node->Windows.Size == 1)
        {
            // Floating window pos/size is authoritative
            ImGuiWindow* single_window = node->Windows[0];
            node->Pos = single_window->Pos;
            node->Size = single_window->SizeFull;
            node->AuthorityForPos = node->AuthorityForSize = node->AuthorityForViewport = ImGuiDataAuthority_Window;

            // Transfer focus immediately so when we revert to a regular window it is immediately selected
            if (node->HostWindow && g.NavWindow == node->HostWindow)
                FocusWindow(single_window);
            if (node->HostWindow)
            {
                single_window->Viewport = node->HostWindow->Viewport;
                single_window->ViewportId = node->HostWindow->ViewportId;
                if (node->HostWindow->ViewportOwned)
                {
                    single_window->Viewport->Window = single_window;
                    single_window->ViewportOwned = true;
                }
            }
        }

        DockNodeHideHostWindow(node);
        node->State = ImGuiDockNodeState_HostWindowHiddenBecauseSingleWindow;
        node->WantCloseAll = false;
        node->WantCloseTabId = 0;
        node->HasCloseButton = node->HasWindowMenuButton = false;
        node->LastFrameActive = g.FrameCount;

        if (node->WantMouseMove && node->Windows.Size == 1)
            DockNodeStartMouseMovingWindow(node, node->Windows[0]);
        return;
    }

    // In some circumstance we will defer creating the host window (so everything will be kept hidden),
    // while the expected visible window is resizing itself.
    // This is important for first-time (no ini settings restored) single window when io.ConfigDockingAlwaysTabBar is enabled,
    // otherwise the node ends up using the minimum window size. Effectively those windows will take an extra frame to show up:
    //   N+0: Begin(): window created (with no known size), node is created
    //   N+1: DockNodeUpdate(): node skip creating host window / Begin(): window size applied, not visible
    //   N+2: DockNodeUpdate(): node can create host window / Begin(): window becomes visible
    // We could remove this frame if we could reliably calculate the expected window size during node update, before the Begin() code.
    // It would require a generalization of CalcWindowExpectedSize(), probably extracting code away from Begin().
    // In reality it isn't very important as user quickly ends up with size data in .ini file.
    if (node->IsVisible && node->HostWindow == NULL && node->IsFloatingNode() && node->IsLeafNode())
    {
        IM_ASSERT(node->Windows.Size > 0);
        ImGuiWindow* ref_window = NULL;
        if (node->SelectedTabId != 0) // Note that we prune single-window-node settings on .ini loading, so this is generally 0 for them!
            ref_window = DockNodeFindWindowByID(node, node->SelectedTabId);
        if (ref_window == NULL)
            ref_window = node->Windows[0];
        if (ref_window->AutoFitFramesX > 0 || ref_window->AutoFitFramesY > 0)
        {
            node->State = ImGuiDockNodeState_HostWindowHiddenBecauseWindowsAreResizing;
            return;
        }
    }

    const ImGuiDockNodeFlags node_flags = node->MergedFlags;

    // Decide if the node will have a close button and a window menu button
    node->HasWindowMenuButton = (node->Windows.Size > 0) && (node_flags & ImGuiDockNodeFlags_NoWindowMenuButton) == 0;
    node->HasCloseButton = false;
    for (int window_n = 0; window_n < node->Windows.Size; window_n++)
    {
        // FIXME-DOCK: Setting DockIsActive here means that for single active window in a leaf node, DockIsActive will be cleared until the next Begin() call.
        ImGuiWindow* window = node->Windows[window_n];
        node->HasCloseButton |= window->HasCloseButton;
        window->DockIsActive = (node->Windows.Size > 1);
    }
    if (node_flags & ImGuiDockNodeFlags_NoCloseButton)
        node->HasCloseButton = false;

    // Bind or create host window
    ImGuiWindow* host_window = NULL;
    bool beginned_into_host_window = false;
    if (node->IsDockSpace())
    {
        // [Explicit root dockspace node]
        IM_ASSERT(node->HostWindow);
        host_window = node->HostWindow;
    }
    else
    {
        // [Automatic root or child nodes]
        if (node->IsRootNode() && node->IsVisible)
        {
            ImGuiWindow* ref_window = (node->Windows.Size > 0) ? node->Windows[0] : NULL;

            // Sync Pos
            if (node->AuthorityForPos == ImGuiDataAuthority_Window && ref_window)
                SetNextWindowPos(ref_window->Pos);
            else if (node->AuthorityForPos == ImGuiDataAuthority_DockNode)
                SetNextWindowPos(node->Pos);

            // Sync Size
            if (node->AuthorityForSize == ImGuiDataAuthority_Window && ref_window)
                SetNextWindowSize(ref_window->SizeFull);
            else if (node->AuthorityForSize == ImGuiDataAuthority_DockNode)
                SetNextWindowSize(node->Size);

            // Sync Collapsed
            if (node->AuthorityForSize == ImGuiDataAuthority_Window && ref_window)
                SetNextWindowCollapsed(ref_window->Collapsed);

            // Sync Viewport
            if (node->AuthorityForViewport == ImGuiDataAuthority_Window && ref_window)
                SetNextWindowViewport(ref_window->ViewportId);

            SetNextWindowClass(&node->WindowClass);

            // Begin into the host window
            char window_label[20];
            DockNodeGetHostWindowTitle(node, window_label, IM_ARRAYSIZE(window_label));
            ImGuiWindowFlags window_flags = ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoScrollWithMouse | ImGuiWindowFlags_DockNodeHost;
            window_flags |= ImGuiWindowFlags_NoFocusOnAppearing;
            window_flags |= ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoNavFocus | ImGuiWindowFlags_NoCollapse;
            window_flags |= ImGuiWindowFlags_NoTitleBar;

            PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(0, 0));
            Begin(window_label, NULL, window_flags);
            PopStyleVar();
            beginned_into_host_window = true;

            host_window = g.CurrentWindow;
            DockNodeSetupHostWindow(node, host_window);
            host_window->DC.CursorPos = host_window->Pos;
            node->Pos = host_window->Pos;
            node->Size = host_window->Size;

            // We set ImGuiWindowFlags_NoFocusOnAppearing because we don't want the host window to take full focus (e.g. steal NavWindow)
            // But we still it bring it to the front of display. There's no way to choose this precise behavior via window flags.
            // One simple case to ponder if: window A has a toggle to create windows B/C/D. Dock B/C/D together, clear the toggle and enable it again.
            // When reappearing B/C/D will request focus and be moved to the top of the display pile, but they are not linked to the dock host window
            // during the frame they appear. The dock host window would keep its old display order, and the sorting in EndFrame would move B/C/D back
            // after the dock host window, losing their top-most status.
            if (node->HostWindow->Appearing)
                BringWindowToDisplayFront(node->HostWindow);

            node->AuthorityForPos = node->AuthorityForSize = node->AuthorityForViewport = ImGuiDataAuthority_Auto;
        }
        else if (node->ParentNode)
        {
            node->HostWindow = host_window = node->ParentNode->HostWindow;
            node->AuthorityForPos = node->AuthorityForSize = node->AuthorityForViewport = ImGuiDataAuthority_Auto;
        }
        if (node->WantMouseMove && node->HostWindow)
            DockNodeStartMouseMovingWindow(node, node->HostWindow);
    }

    // Update focused node (the one whose title bar is highlight) within a node tree
    if (node->IsSplitNode())
        IM_ASSERT(node->TabBar == NULL);
    if (node->IsRootNode())
        if (g.NavWindow && g.NavWindow->RootWindow->DockNode && g.NavWindow->RootWindow->ParentWindow == host_window)
            node->LastFocusedNodeId = g.NavWindow->RootWindow->DockNode->ID;

    // We need to draw a background at the root level if requested by ImGuiDockNodeFlags_PassthruCentralNode, but we will only know the correct pos/size
    // _after_ processing the resizing splitters. So we are using the DrawList channel splitting facility to submit drawing primitives out of order!
    const bool render_dockspace_bg = node->IsRootNode() && host_window && (node_flags & ImGuiDockNodeFlags_PassthruCentralNode) != 0;
    if (render_dockspace_bg)
    {
        host_window->DrawList->ChannelsSplit(2);
        host_window->DrawList->ChannelsSetCurrent(1);
    }

    // Register a hit-test hole in the window unless we are currently dragging a window that is compatible with our dockspace
    ImGuiDockNode* central_node = node->CentralNode;
    const bool central_node_hole = node->IsRootNode() && host_window && (node_flags & ImGuiDockNodeFlags_PassthruCentralNode) != 0 && central_node != NULL && central_node->IsEmpty();
    bool central_node_hole_register_hit_test_hole = central_node_hole;
    if (central_node_hole)
        if (const ImGuiPayload* payload = ImGui::GetDragDropPayload())
            if (payload->IsDataType(IMGUI_PAYLOAD_TYPE_WINDOW) && DockNodeIsDropAllowed(host_window, *(ImGuiWindow**)payload->Data))
                central_node_hole_register_hit_test_hole = false;
    if (central_node_hole_register_hit_test_hole)
    {
        // We add a little padding to match the "resize from edges" behavior and allow grabbing the splitter easily.
        // (But we only add it if there's something else on the other side of the hole, otherwise for e.g. fullscreen
        // covering passthru node we'd have a gap on the edge not covered by the hole)
        IM_ASSERT(node->IsDockSpace()); // We cannot pass this flag without the DockSpace() api. Testing this because we also setup the hole in host_window->ParentNode
        ImGuiDockNode* root_node = DockNodeGetRootNode(central_node);
        ImRect root_rect(root_node->Pos, root_node->Pos + root_node->Size);
        ImRect hole_rect(central_node->Pos, central_node->Pos + central_node->Size);
        if (hole_rect.Min.x > root_rect.Min.x) { hole_rect.Min.x += WINDOWS_HOVER_PADDING; }
        if (hole_rect.Max.x < root_rect.Max.x) { hole_rect.Max.x -= WINDOWS_HOVER_PADDING; }
        if (hole_rect.Min.y > root_rect.Min.y) { hole_rect.Min.y += WINDOWS_HOVER_PADDING; }
        if (hole_rect.Max.y < root_rect.Max.y) { hole_rect.Max.y -= WINDOWS_HOVER_PADDING; }
        //GetForegroundDrawList()->AddRect(hole_rect.Min, hole_rect.Max, IM_COL32(255, 0, 0, 255));
        if (central_node_hole && !hole_rect.IsInverted())
        {
            SetWindowHitTestHole(host_window, hole_rect.Min, hole_rect.Max - hole_rect.Min);
            SetWindowHitTestHole(host_window->ParentWindow, hole_rect.Min, hole_rect.Max - hole_rect.Min);
        }
    }

    // Update position/size, process and draw resizing splitters
    if (node->IsRootNode() && host_window)
    {
        DockNodeTreeUpdatePosSize(node, host_window->Pos, host_window->Size);
        DockNodeTreeUpdateSplitter(node);
    }

    // Draw empty node background (currently can only be the Central Node)
    if (host_window && node->IsEmpty() && node->IsVisible && !(node_flags & ImGuiDockNodeFlags_PassthruCentralNode))
        host_window->DrawList->AddRectFilled(node->Pos, node->Pos + node->Size, GetColorU32(ImGuiCol_DockingEmptyBg));

    // Draw whole dockspace background if ImGuiDockNodeFlags_PassthruCentralNode if set.
    if (render_dockspace_bg && node->IsVisible)
    {
        host_window->DrawList->ChannelsSetCurrent(0);
        if (central_node_hole)
            RenderRectFilledWithHole(host_window->DrawList, node->Rect(), central_node->Rect(), GetColorU32(ImGuiCol_WindowBg), 0.0f);
        else
            host_window->DrawList->AddRectFilled(node->Pos, node->Pos + node->Size, GetColorU32(ImGuiCol_WindowBg), 0.0f);
        host_window->DrawList->ChannelsMerge();
    }

    // Draw and populate Tab Bar
    if (host_window && node->Windows.Size > 0)
    {
        DockNodeUpdateTabBar(node, host_window);
    }
    else
    {
        node->WantCloseAll = false;
        node->WantCloseTabId = 0;
        node->IsFocused = false;
    }
    if (node->TabBar && node->TabBar->SelectedTabId)
        node->SelectedTabId = node->TabBar->SelectedTabId;
    else if (node->Windows.Size > 0)
        node->SelectedTabId = node->Windows[0]->ID;

    // Draw payload drop target
    if (host_window && node->IsVisible)
        if (node->IsRootNode() && (g.MovingWindow == NULL || g.MovingWindow->RootWindowDockTree != host_window))
            BeginDockableDragDropTarget(host_window);

    // We update this after DockNodeUpdateTabBar()
    node->LastFrameActive = g.FrameCount;

    // Recurse into children
    // FIXME-DOCK FIXME-OPT: Should not need to recurse into children
    if (host_window)
    {
        if (node->ChildNodes[0])
            DockNodeUpdate(node->ChildNodes[0]);
        if (node->ChildNodes[1])
            DockNodeUpdate(node->ChildNodes[1]);

        // Render outer borders last (after the tab bar)
        if (node->IsRootNode())
            RenderWindowOuterBorders(host_window);
    }

    // End host window
    if (beginned_into_host_window) //-V1020
        End();
}